

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O1

void __thiscall MipsGenerator::GenerateStore(MipsGenerator *this,string *temp_name,string *type)

{
  undefined8 *puVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  int iVar4;
  undefined8 *puVar5;
  uint *puVar6;
  long *plVar7;
  uint uVar8;
  ulong *puVar9;
  ulong uVar10;
  FILE *__stream;
  uint __len;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  iVar4 = std::__cxx11::string::compare((char *)type);
  if (iVar4 != 0) {
    iVar4 = std::__cxx11::string::compare((char *)type);
    local_f0 = local_e0;
    if (iVar4 == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"sw ","");
      local_110 = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"$25","");
      uVar10 = 0xf;
      if (local_f0 != local_e0) {
        uVar10 = local_e0[0];
      }
      if (uVar10 < (ulong)(local_108 + local_e8)) {
        uVar10 = 0xf;
        if (local_110 != local_100) {
          uVar10 = local_100[0];
        }
        if (uVar10 < (ulong)(local_108 + local_e8)) goto LAB_001530fc;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
      }
      else {
LAB_001530fc:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
      }
      local_170 = &local_160;
      puVar1 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar1) {
        local_160 = *puVar1;
        uStack_158 = puVar5[3];
      }
      else {
        local_160 = *puVar1;
        local_170 = (undefined8 *)*puVar5;
      }
      local_168 = puVar5[1];
      *puVar5 = puVar1;
      puVar5[1] = 0;
      *(undefined1 *)puVar1 = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
      local_d0 = &local_c0;
      puVar9 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar9) {
        local_c0 = *puVar9;
        lStack_b8 = puVar5[3];
      }
      else {
        local_c0 = *puVar9;
        local_d0 = (ulong *)*puVar5;
      }
      local_c8 = puVar5[1];
      *puVar5 = puVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_d0,(ulong)(temp_name->_M_dataplus)._M_p);
      puVar9 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar9) {
        local_140 = *puVar9;
        uStack_138 = *(undefined4 *)(puVar5 + 3);
        uStack_134 = *(undefined4 *)((long)puVar5 + 0x1c);
        local_150 = &local_140;
      }
      else {
        local_140 = *puVar9;
        local_150 = (ulong *)*puVar5;
      }
      local_148 = puVar5[1];
      *puVar5 = puVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      local_130 = local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"($28)","");
      uVar10 = 0xf;
      if (local_150 != &local_140) {
        uVar10 = local_140;
      }
      if (uVar10 < (ulong)(local_128 + local_148)) {
        uVar10 = 0xf;
        if (local_130 != local_120) {
          uVar10 = local_120[0];
        }
        if (uVar10 < (ulong)(local_128 + local_148)) goto LAB_0015358e;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_150);
      }
      else {
LAB_0015358e:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_130);
      }
      local_90 = &local_80;
      puVar1 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar1) {
        local_80 = *puVar1;
        uStack_78 = *(undefined4 *)(puVar5 + 3);
        uStack_74 = *(undefined4 *)((long)puVar5 + 0x1c);
      }
      else {
        local_90 = (undefined8 *)*puVar5;
        local_80 = *puVar1;
      }
      local_88 = puVar5[1];
      *puVar5 = puVar1;
      puVar5[1] = 0;
      *(undefined1 *)puVar1 = 0;
      __stream = (FILE *)this->m_fp_mips;
      puVar5 = &local_80;
      goto LAB_0015360c;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"sw ","");
    local_110 = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"$25","");
    uVar10 = 0xf;
    if (local_f0 != local_e0) {
      uVar10 = local_e0[0];
    }
    if (uVar10 < (ulong)(local_108 + local_e8)) {
      uVar10 = 0xf;
      if (local_110 != local_100) {
        uVar10 = local_100[0];
      }
      if (uVar10 < (ulong)(local_108 + local_e8)) goto LAB_00152fa4;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
    }
    else {
LAB_00152fa4:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
    }
    local_170 = &local_160;
    puVar1 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar1) {
      local_160 = *puVar1;
      uStack_158 = puVar5[3];
    }
    else {
      local_160 = *puVar1;
      local_170 = (undefined8 *)*puVar5;
    }
    local_168 = puVar5[1];
    *puVar5 = puVar1;
    puVar5[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_170);
    local_d0 = &local_c0;
    puVar9 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar9) {
      local_c0 = *puVar9;
      lStack_b8 = plVar7[3];
    }
    else {
      local_c0 = *puVar9;
      local_d0 = (ulong *)*plVar7;
    }
    local_c8 = plVar7[1];
    *plVar7 = (long)puVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(temp_name->_M_dataplus)._M_p);
    puVar9 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar9) {
      local_140 = *puVar9;
      uStack_138 = (undefined4)plVar7[3];
      uStack_134 = *(undefined4 *)((long)plVar7 + 0x1c);
      local_150 = &local_140;
    }
    else {
      local_140 = *puVar9;
      local_150 = (ulong *)*plVar7;
    }
    local_148 = plVar7[1];
    *plVar7 = (long)puVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_130 = local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"($fp)","");
    uVar10 = 0xf;
    if (local_150 != &local_140) {
      uVar10 = local_140;
    }
    if (uVar10 < (ulong)(local_128 + local_148)) {
      uVar10 = 0xf;
      if (local_130 != local_120) {
        uVar10 = local_120[0];
      }
      if (uVar10 < (ulong)(local_128 + local_148)) goto LAB_00153280;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_150);
    }
    else {
LAB_00153280:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_130);
    }
    local_b0 = &local_a0;
    puVar1 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar1) {
      local_a0 = *puVar1;
      uStack_98 = *(undefined4 *)(puVar5 + 3);
      uStack_94 = *(undefined4 *)((long)puVar5 + 0x1c);
    }
    else {
      local_b0 = (undefined8 *)*puVar5;
      local_a0 = *puVar1;
    }
    local_a8 = puVar5[1];
    *puVar5 = puVar1;
    puVar5[1] = 0;
    *(undefined1 *)puVar1 = 0;
    __stream = (FILE *)this->m_fp_mips;
    puVar5 = &local_a0;
LAB_0015360c:
    fprintf(__stream,"%s\n",puVar5[-2]);
    if ((undefined8 *)puVar5[-2] != puVar5) {
      operator_delete((undefined8 *)puVar5[-2]);
    }
    if (local_130 != local_120) {
      operator_delete(local_130);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170);
    }
    if (local_110 != local_100) {
      operator_delete(local_110);
    }
    if (local_f0 == local_e0) {
      return;
    }
    operator_delete(local_f0);
    return;
  }
  uVar2 = this->m_relative_addr;
  puVar6 = (uint *)std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->m_temp2address,temp_name);
  *puVar6 = uVar2;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"sw ","");
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"$25","");
  uVar10 = 0xf;
  if (local_f0 != local_e0) {
    uVar10 = local_e0[0];
  }
  if (uVar10 < (ulong)(local_108 + local_e8)) {
    uVar10 = 0xf;
    if (local_110 != local_100) {
      uVar10 = local_100[0];
    }
    if (uVar10 < (ulong)(local_108 + local_e8)) goto LAB_00153063;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_00153063:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
  }
  local_170 = &local_160;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_160 = *puVar1;
    uStack_158 = puVar5[3];
  }
  else {
    local_160 = *puVar1;
    local_170 = (undefined8 *)*puVar5;
  }
  local_168 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_170);
  local_d0 = &local_c0;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_c0 = *puVar9;
    lStack_b8 = plVar7[3];
  }
  else {
    local_c0 = *puVar9;
    local_d0 = (ulong *)*plVar7;
  }
  local_c8 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_001536a2;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_001536a2;
      }
      if (uVar8 < 10000) goto LAB_001536a2;
      uVar10 = uVar10 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_001536a2:
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_130),__len,__val);
  uVar10 = 0xf;
  if (local_d0 != &local_c0) {
    uVar10 = local_c0;
  }
  if (uVar10 < (ulong)(local_128 + local_c8)) {
    uVar10 = 0xf;
    if (local_130 != local_120) {
      uVar10 = local_120[0];
    }
    if (uVar10 < (ulong)(local_128 + local_c8)) goto LAB_00153723;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_00153723:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_130);
  }
  local_150 = &local_140;
  puVar9 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar9) {
    local_140 = *puVar9;
    uStack_138 = *(undefined4 *)(puVar5 + 3);
    uStack_134 = *(undefined4 *)((long)puVar5 + 0x1c);
  }
  else {
    local_140 = *puVar9;
    local_150 = (ulong *)*puVar5;
  }
  local_148 = puVar5[1];
  *puVar5 = puVar9;
  puVar5[1] = 0;
  *(undefined1 *)puVar9 = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"($sp)","");
  uVar10 = 0xf;
  if (local_150 != &local_140) {
    uVar10 = local_140;
  }
  if (uVar10 < (ulong)(local_68 + local_148)) {
    uVar10 = 0xf;
    if (local_70 != local_60) {
      uVar10 = local_60[0];
    }
    if ((ulong)(local_68 + local_148) <= uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_150);
      goto LAB_00153821;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_70);
LAB_00153821:
  local_50 = &local_40;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_40 = *puVar1;
    uStack_38 = *(undefined4 *)(puVar5 + 3);
    uStack_34 = *(undefined4 *)((long)puVar5 + 0x1c);
  }
  else {
    local_40 = *puVar1;
    local_50 = (undefined8 *)*puVar5;
  }
  local_48 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  fprintf((FILE *)this->m_fp_mips,"%s\n",local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  this->m_relative_addr = this->m_relative_addr + 4;
  return;
}

Assistant:

void MipsGenerator::GenerateStore(string temp_name, string type) {
    if (type == TMP) {
        int store_offset = m_relative_addr;
        m_temp2address[temp_name] = store_offset;
        Output2File(string("sw ") + NUM1 + " -" + std::to_string(store_offset) + string("($sp)"));
        m_relative_addr += 4;
    } else if (type == GLOBAL) {
        Output2File(string("sw ") + NUM1 + " " + temp_name + string("($28)"));
    } else {
        Output2File(string("sw ") + NUM1 + " -" + temp_name + string("($fp)"));
    }
}